

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

bool __thiscall
QUrlPrivate::validateComponent
          (QUrlPrivate *this,Section section,QString *input,qsizetype begin,qsizetype end)

{
  bool bVar1;
  uint __c;
  QChar *pQVar2;
  char *pcVar3;
  QUrlPrivate *in_RCX;
  byte in_SIL;
  QUrlPrivate *in_R8;
  size_t j;
  ErrorCode errorCode;
  bool error;
  uint uc;
  size_t i;
  ushort *data;
  QUrlPrivate *local_58;
  uint in_stack_ffffffffffffffb8;
  QUrlPrivate *source;
  
  pQVar2 = QString::constData((QString *)0x2fac47);
  source = in_RCX;
  do {
    if (in_R8 <= source) {
      return true;
    }
    __c = (uint)(ushort)pQVar2[(long)source].ucs;
    if (__c < 0x80) {
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 & 0xffffff;
      if (((__c == 0x25) &&
          (((in_R8 < (QUrlPrivate *)((long)&((DataPointer *)&source->ref)->d + 2U) ||
            (bVar1 = isHex('\0'), !bVar1)) || (bVar1 = isHex('\0'), !bVar1)))) ||
         ((__c < 0x21 || (pcVar3 = strchr("\"<>\\^`{|}\x7f",__c), pcVar3 != (char *)0x0)))) {
        in_stack_ffffffffffffffb8 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
      }
      else if ((in_SIL & 6) != 0) {
        if ((in_SIL == 6) && (pcVar3 = strchr("/?#[]@",__c), pcVar3 != (char *)0x0)) {
          in_stack_ffffffffffffffb8 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
        }
        else if ((in_SIL != 6) && (pcVar3 = strchr(":/?#[]@",__c), pcVar3 != (char *)0x0)) {
          in_stack_ffffffffffffffb8 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
        }
      }
      if ((in_stack_ffffffffffffffb8 & 0x1000000) != 0) {
        local_58 = in_RCX;
        if (in_SIL == 6) {
          for (; (local_58 < source && (pQVar2[(long)local_58].ucs != L':'));
              local_58 = (QUrlPrivate *)((long)&((DataPointer *)&local_58->ref)->d + 1)) {
          }
        }
        setError(in_R8,(ErrorCode)((ulong)pQVar2 >> 0x20),(QString *)source,
                 CONCAT44(__c,in_stack_ffffffffffffffb8));
        return false;
      }
    }
    source = (QUrlPrivate *)((long)&((DataPointer *)&source->ref)->d + 1);
  } while( true );
}

Assistant:

bool QUrlPrivate::validateComponent(QUrlPrivate::Section section, const QString &input,
                                    qsizetype begin, qsizetype end)
{
    // What we need to look out for, that the regular parser tolerates:
    //  - percent signs not followed by two hex digits
    //  - forbidden characters, which should always appear encoded
    //    '"' / '<' / '>' / '\' / '^' / '`' / '{' / '|' / '}' / BKSP
    //    control characters
    //  - delimiters not allowed in certain positions
    //    . scheme: parser is already strict
    //    . user info: gen-delims except ":" disallowed ("/" / "?" / "#" / "[" / "]" / "@")
    //    . host: parser is stricter than the standard
    //    . port: parser is stricter than the standard
    //    . path: all delimiters allowed
    //    . fragment: all delimiters allowed
    //    . query: all delimiters allowed
    static const char forbidden[] = "\"<>\\^`{|}\x7F";
    static const char forbiddenUserInfo[] = ":/?#[]@";

    Q_ASSERT(section != Authority && section != Hierarchy && section != FullUrl);

    const ushort *const data = reinterpret_cast<const ushort *>(input.constData());
    for (size_t i = size_t(begin); i < size_t(end); ++i) {
        uint uc = data[i];
        if (uc >= 0x80)
            continue;

        bool error = false;
        if ((uc == '%' && (size_t(end) < i + 2 || !isHex(data[i + 1]) || !isHex(data[i + 2])))
                || uc <= 0x20 || strchr(forbidden, uc)) {
            // found an error
            error = true;
        } else if (section & UserInfo) {
            if (section == UserInfo && strchr(forbiddenUserInfo + 1, uc))
                error = true;
            else if (section != UserInfo && strchr(forbiddenUserInfo, uc))
                error = true;
        }

        if (!error)
            continue;

        ErrorCode errorCode = ErrorCode(int(section) << 8);
        if (section == UserInfo) {
            // is it the user name or the password?
            errorCode = InvalidUserNameError;
            for (size_t j = size_t(begin); j < i; ++j)
                if (data[j] == ':') {
                    errorCode = InvalidPasswordError;
                    break;
                }
        }

        setError(errorCode, input, i);
        return false;
    }

    // no errors
    return true;
}